

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DatePartBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  function_statistics_t p_Var2;
  pointer pcVar3;
  ulong uVar4;
  size_type sVar5;
  undefined8 uVar6;
  DatePartSpecifier DVar7;
  byte bVar8;
  int iVar9;
  reference pvVar10;
  pointer pEVar11;
  type expr;
  undefined **ppuVar12;
  BinderException *pBVar13;
  undefined **ppuVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  string part_name;
  Value part_value;
  string local_108;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  Value local_70;
  
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  iVar9 = (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[6])(pEVar11);
  if ((char)iVar9 != '\0') {
LAB_019d91c5:
    *(undefined8 *)this = 0;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  iVar9 = (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar11);
  if ((char)iVar9 == '\0') goto LAB_019d91c5;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (pvVar10);
  ExpressionExecutor::EvaluateScalar(&local_70,context,expr,false);
  Value::ToString_abi_cxx11_(&local_90,&local_70);
  DVar7 = GetDatePartSpecifier(&local_90);
  if (DVar7 == BEGIN_DOUBLE) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_erase((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)arguments,
               (arguments->
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_erase
              (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start);
    ::std::__cxx11::string::_M_replace
              ((ulong)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name,0,
               (char *)(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name._M_string_length,0x1e56939);
    LogicalType::LogicalType((LogicalType *)&local_108,DOUBLE);
    uVar6 = local_108.field_2._M_allocated_capacity;
    sVar5 = local_108._M_string_length;
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_108._M_dataplus._M_p;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_108._M_dataplus._M_p._1_1_;
    uVar15 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar16 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar17 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar18 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    p_Var1 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_e8 = uVar15;
      uStack_e4 = uVar16;
      uStack_e0 = uVar17;
      uStack_dc = uVar18;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar15 = local_e8;
      uVar16 = uStack_e4;
      uVar17 = uStack_e0;
      uVar18 = uStack_dc;
    }
    uVar6 = local_108.field_2._M_allocated_capacity;
    local_108._M_string_length = CONCAT44(uVar16,uVar15);
    local_108.field_2._M_allocated_capacity._4_4_ = uVar18;
    local_108.field_2._M_allocated_capacity._0_4_ = uVar17;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
    }
    LogicalType::~LogicalType((LogicalType *)&local_108);
    pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,0);
    pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar10);
    bVar8 = (pEVar11->return_type).id_ - DATE;
    if ((0x13 < bVar8) || ((0x8103fU >> (bVar8 & 0x1f) & 1) == 0)) {
      pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"%s can only take temporal arguments","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,
                 pcVar3 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                          super_Function.name._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar13,&local_108,&local_d0);
      __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar4 = (ulong)bVar8;
    ppuVar12 = &PTR_UnaryFunction<duckdb::date_t,double,duckdb::DatePart::EpochOperator>_024b54f0 +
               uVar4;
    ppuVar14 = &PTR_PropagateStatistics<duckdb::date_t>_024b5590;
  }
  else {
    if (DVar7 != JULIAN_DAY) goto LAB_019d92de;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_erase((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)arguments,
               (arguments->
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_erase
              (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start);
    ::std::__cxx11::string::_M_replace
              ((ulong)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name,0,
               (char *)(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name._M_string_length,0x1de8279);
    LogicalType::LogicalType((LogicalType *)&local_108,DOUBLE);
    uVar6 = local_108.field_2._M_allocated_capacity;
    sVar5 = local_108._M_string_length;
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_108._M_dataplus._M_p;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_108._M_dataplus._M_p._1_1_;
    uVar15 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar16 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar17 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar18 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    p_Var1 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_e8 = uVar15;
      uStack_e4 = uVar16;
      uStack_e0 = uVar17;
      uStack_dc = uVar18;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar15 = local_e8;
      uVar16 = uStack_e4;
      uVar17 = uStack_e0;
      uVar18 = uStack_dc;
    }
    uVar6 = local_108.field_2._M_allocated_capacity;
    local_108._M_string_length = CONCAT44(uVar16,uVar15);
    local_108.field_2._M_allocated_capacity._4_4_ = uVar18;
    local_108.field_2._M_allocated_capacity._0_4_ = uVar17;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
    }
    LogicalType::~LogicalType((LogicalType *)&local_108);
    pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,0);
    pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar10);
    bVar8 = (pEVar11->return_type).id_ - DATE;
    if ((5 < bVar8) || ((0x3dU >> (bVar8 & 0x1f) & 1) == 0)) {
      pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"%s can only take DATE or TIMESTAMP arguments","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar3 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,
                 pcVar3 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                          super_Function.name._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar13,&local_108,&local_b0);
      __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar4 = (ulong)bVar8;
    ppuVar12 = &
               PTR_UnaryFunction<duckdb::date_t,double,duckdb::DatePart::JulianDayOperator>_024b5490
               + uVar4;
    ppuVar14 = &PTR_PropagateStatistics<duckdb::date_t>_024b54c0;
  }
  p_Var2 = (function_statistics_t)ppuVar14[uVar4];
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)*ppuVar12);
  bound_function->statistics = p_Var2;
LAB_019d92de:
  *(undefined8 *)this = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  Value::~Value(&local_70);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> DatePartBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {
	//	If we are only looking for Julian Days for timestamps,
	//	then return doubles.
	if (arguments[0]->HasParameter() || !arguments[0]->IsFoldable()) {
		return nullptr;
	}

	Value part_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	const auto part_name = part_value.ToString();
	switch (GetDatePartSpecifier(part_name)) {
	case DatePartSpecifier::JULIAN_DAY:
		arguments.erase(arguments.begin());
		bound_function.arguments.erase(bound_function.arguments.begin());
		bound_function.name = "julian";
		bound_function.return_type = LogicalType::DOUBLE;
		switch (arguments[0]->return_type.id()) {
		case LogicalType::TIMESTAMP:
		case LogicalType::TIMESTAMP_S:
		case LogicalType::TIMESTAMP_MS:
		case LogicalType::TIMESTAMP_NS:
			bound_function.function = DatePart::UnaryFunction<timestamp_t, double, DatePart::JulianDayOperator>;
			bound_function.statistics = DatePart::JulianDayOperator::template PropagateStatistics<timestamp_t>;
			break;
		case LogicalType::DATE:
			bound_function.function = DatePart::UnaryFunction<date_t, double, DatePart::JulianDayOperator>;
			bound_function.statistics = DatePart::JulianDayOperator::template PropagateStatistics<date_t>;
			break;
		default:
			throw BinderException("%s can only take DATE or TIMESTAMP arguments", bound_function.name);
		}
		break;
	case DatePartSpecifier::EPOCH:
		arguments.erase(arguments.begin());
		bound_function.arguments.erase(bound_function.arguments.begin());
		bound_function.name = "epoch";
		bound_function.return_type = LogicalType::DOUBLE;
		switch (arguments[0]->return_type.id()) {
		case LogicalType::TIMESTAMP:
		case LogicalType::TIMESTAMP_S:
		case LogicalType::TIMESTAMP_MS:
		case LogicalType::TIMESTAMP_NS:
			bound_function.function = DatePart::UnaryFunction<timestamp_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<timestamp_t>;
			break;
		case LogicalType::DATE:
			bound_function.function = DatePart::UnaryFunction<date_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<date_t>;
			break;
		case LogicalType::INTERVAL:
			bound_function.function = DatePart::UnaryFunction<interval_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<interval_t>;
			break;
		case LogicalType::TIME:
			bound_function.function = DatePart::UnaryFunction<dtime_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<dtime_t>;
			break;
		case LogicalType::TIME_TZ:
			bound_function.function = DatePart::UnaryFunction<dtime_tz_t, double, DatePart::EpochOperator>;
			bound_function.statistics = DatePart::EpochOperator::template PropagateStatistics<dtime_tz_t>;
			break;
		default:
			throw BinderException("%s can only take temporal arguments", bound_function.name);
		}
		break;
	default:
		break;
	}

	return nullptr;
}